

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O0

int factorial(int32_t a)

{
  int local_4c;
  int local_48;
  int i;
  uint32_t factorial;
  allocator<char> local_31;
  string local_30;
  int32_t local_c;
  int32_t a_local;
  
  local_c = a;
  if (a < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"factorial is not defined for negative numbers",&local_31);
    error(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  local_48 = 1;
  if (local_c != 0) {
    for (local_4c = 1; local_4c < local_c; local_4c = local_4c + 1) {
      local_48 = local_4c * local_48;
    }
  }
  return local_48;
}

Assistant:

int factorial(int32_t a)
{
	if (a < 0)
		error("factorial is not defined for negative numbers");
	uint32_t factorial = 1;
	if (a != 0)
	{
		for (int i = 1; i < a; ++i)
			factorial *= i;
	}
	return factorial;
}